

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userobject.cpp
# Opt level: O0

UserObject * __thiscall camp::UserObject::operator=(UserObject *this,UserObject *other)

{
  bool bVar1;
  ParentObject *pPVar2;
  ParentObject *pPVar3;
  ParentObject *local_68;
  scoped_ptr<camp::ParentObject> local_20;
  scoped_ptr<camp::ParentObject> parent;
  UserObject *other_local;
  UserObject *this_local;
  
  parent.px = (ParentObject *)other;
  bVar1 = boost::scoped_ptr::operator_cast_to_bool((scoped_ptr *)&other->m_parent);
  if (bVar1) {
    local_68 = (ParentObject *)operator_new(0x58);
    pPVar3 = boost::scoped_ptr<camp::ParentObject>::operator->(&((parent.px)->object).m_parent);
    pPVar2 = boost::scoped_ptr<camp::ParentObject>::operator->(&((parent.px)->object).m_parent);
    ParentObject::ParentObject(local_68,&pPVar3->object,pPVar2->member);
  }
  else {
    local_68 = (ParentObject *)0x0;
  }
  boost::scoped_ptr<camp::ParentObject>::scoped_ptr(&local_20,local_68);
  this->m_class = ((parent.px)->object).m_class;
  std::shared_ptr<camp::detail::AbstractObjectHolder>::operator=
            (&this->m_holder,&((parent.px)->object).m_holder);
  boost::scoped_ptr<camp::ParentObject>::swap(&this->m_parent,&local_20);
  this->m_child = (UserObject *)0x0;
  bVar1 = boost::scoped_ptr::operator_cast_to_bool((scoped_ptr *)&this->m_parent);
  if (bVar1) {
    pPVar3 = boost::scoped_ptr<camp::ParentObject>::operator->(&this->m_parent);
    (pPVar3->object).m_child = this;
  }
  boost::scoped_ptr<camp::ParentObject>::~scoped_ptr(&local_20);
  return this;
}

Assistant:

UserObject& UserObject::operator=(const UserObject& other)
{
    boost::scoped_ptr<ParentObject> parent(other.m_parent ? new ParentObject(other.m_parent->object, other.m_parent->member) : 0);

    m_class = other.m_class;
    m_holder = other.m_holder;
    m_parent.swap(parent);
    m_child = 0;

    if (m_parent)
        m_parent->object.m_child = this;

    return *this;
}